

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_filter_compress.c
# Opt level: O0

void test_read_filter_compress_truncated(void)

{
  int iVar1;
  archive *_a;
  archive *a;
  char data [2];
  
  a._6_2_ = 0x9d1f;
  _a = archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_filter_compress.c"
                   ,L' ',(uint)(_a != (archive *)0x0),"(a = archive_read_new()) != NULL",(void *)0x0
                  );
  iVar1 = archive_read_support_filter_compress(_a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_filter_compress.c"
                      ,L'!',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_compress(a)",_a)
  ;
  iVar1 = archive_read_support_format_all(_a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_filter_compress.c"
                      ,L'\"',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",_a);
  iVar1 = archive_read_open_memory(_a,(void *)((long)&a + 6),2);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_filter_compress.c"
                      ,L'$',-0x1e,"ARCHIVE_FATAL",(long)iVar1,
                      "archive_read_open_memory(a, data, sizeof(data))",_a);
  iVar1 = archive_read_close(_a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_filter_compress.c"
                      ,L'&',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",(void *)0x0);
  iVar1 = archive_read_free(_a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_filter_compress.c"
                      ,L'\'',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  return;
}

Assistant:

DEFINE_TEST(test_read_filter_compress_truncated)
{
	const char data[] = {0x1f, 0x9d};
	struct archive *a;

	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_compress(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	assertEqualIntA(a, ARCHIVE_FATAL,
	    archive_read_open_memory(a, data, sizeof(data)));

	assertEqualInt(ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}